

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

DefaultPropertyCaseItemSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::DefaultPropertyCaseItemSyntax,slang::syntax::DefaultPropertyCaseItemSyntax_const&>
          (BumpAllocator *this,DefaultPropertyCaseItemSyntax *args)

{
  undefined4 uVar1;
  DefaultPropertyCaseItemSyntax *pDVar2;
  long lVar3;
  DefaultPropertyCaseItemSyntax *pDVar4;
  byte bVar5;
  
  bVar5 = 0;
  pDVar2 = (DefaultPropertyCaseItemSyntax *)allocate(this,0x50,8);
  pDVar4 = pDVar2;
  for (lVar3 = 10; lVar3 != 0; lVar3 = lVar3 + -1) {
    uVar1 = *(undefined4 *)&(args->super_PropertyCaseItemSyntax).super_SyntaxNode.field_0x4;
    (pDVar4->super_PropertyCaseItemSyntax).super_SyntaxNode.kind =
         (args->super_PropertyCaseItemSyntax).super_SyntaxNode.kind;
    *(undefined4 *)&(pDVar4->super_PropertyCaseItemSyntax).super_SyntaxNode.field_0x4 = uVar1;
    args = (DefaultPropertyCaseItemSyntax *)((long)args + (ulong)bVar5 * -0x10 + 8);
    pDVar4 = (DefaultPropertyCaseItemSyntax *)((long)pDVar4 + (ulong)bVar5 * -0x10 + 8);
  }
  return pDVar2;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }